

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void merge_lcp_2way_unstable<false>
               (uchar **from0,lcp_t *lcp_input0,size_t n0,uchar **from1,lcp_t *lcp_input1,size_t n1,
               uchar **result,lcp_t *lcp_result)

{
  uchar *puVar1;
  long lVar2;
  int iVar3;
  lcp_t *plVar4;
  uchar **ppuVar5;
  uchar **__dest;
  char *pcVar6;
  lcp_t lcp1;
  long lVar7;
  uchar **ppuVar8;
  size_t local_70;
  size_t local_68;
  lcp_t *local_60;
  lcp_t local_58;
  lcp_t *local_50;
  lcp_t local_40;
  int local_38;
  
  check_input(from0,lcp_input0,n0);
  check_input(from1,lcp_input1,n1);
  compare((uchar *)&local_40,*from0,(size_t)*from1);
  if (local_38 < 1) {
    puVar1 = *from0;
    from0 = from0 + 1;
    *result = puVar1;
    __dest = result + 1;
    local_70 = n0 - 1;
    local_58 = *lcp_input0;
    local_50 = lcp_input0 + 1;
    lcp1 = local_40;
    local_68 = n1;
    local_60 = lcp_input1;
  }
  else {
    *result = *from1;
    __dest = result + 1;
    local_68 = n1 - 1;
    ppuVar5 = from0;
    if (local_68 == 0) {
joined_r0x001d2755:
      if (n0 == 0) {
        return;
      }
LAB_001d2733:
      memmove(__dest,ppuVar5,n0 << 3);
      return;
    }
    from1 = from1 + 1;
    local_58 = local_40;
    local_60 = lcp_input1 + 1;
    lcp1 = *lcp_input1;
    local_70 = n0;
    local_50 = lcp_input0;
  }
LAB_001d24a8:
  do {
    lVar7 = 0;
    ppuVar8 = __dest;
    while( true ) {
      check_lcps(*(uchar **)((long)__dest + lVar7 + -8),*from0,local_58,
                 *(uchar **)((long)from1 + lVar7),lcp1);
      if (lcp1 < local_58) break;
      ppuVar5 = from0;
      n0 = local_70;
      if (lcp1 <= local_58) {
        compare((uchar *)&local_40,*from0,*(size_t *)((long)from1 + lVar7));
        local_58 = local_40;
        if (local_38 < 0) {
          *(uchar **)((long)__dest + lVar7) = *from0;
          lcp1 = local_40;
          goto joined_r0x001d2643;
        }
        if (local_38 != 0) {
          *(undefined8 *)((long)__dest + lVar7) = *(undefined8 *)((long)from1 + lVar7);
          if (local_68 != 1) {
            __dest = (uchar **)((long)__dest + lVar7 + 8);
            local_68 = local_68 - 1;
            from1 = (uchar **)((long)from1 + lVar7 + 8);
            plVar4 = (lcp_t *)((long)local_60 + lVar7);
            local_60 = plVar4 + 1;
            lcp1 = *plVar4;
            goto LAB_001d24a8;
          }
          __dest = (uchar **)((long)__dest + lVar7 + 8);
          goto joined_r0x001d2755;
        }
        puVar1 = *from0;
        if (puVar1 == (uchar *)0x0) goto LAB_001d27a6;
        if (*(char **)((long)from1 + lVar7) == (char *)0x0) goto LAB_001d27c5;
        iVar3 = strcmp((char *)puVar1,*(char **)((long)from1 + lVar7));
        if (iVar3 != 0) {
          __assert_fail("cmp(*from0, *from1)==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x664,
                        "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                       );
        }
        if (local_70 == 0) {
          pcVar6 = "n0";
        }
        else {
          if (local_68 != 0) {
            *(uchar **)((long)__dest + lVar7) = puVar1;
            *(undefined8 *)((long)__dest + lVar7 + 8) = *(undefined8 *)((long)from1 + lVar7);
            n0 = local_70 - 1;
            if (n0 == 0) {
              local_68 = local_68 - 1;
              __dest = (uchar **)((long)__dest + lVar7 + 0x10);
              lVar7 = lVar7 + 8;
              goto LAB_001d2752;
            }
            ppuVar5 = from0 + 1;
            if (local_68 == 1) {
              __dest = (uchar **)((long)__dest + lVar7 + 0x10);
              goto LAB_001d2733;
            }
            lVar2 = lVar7 + 0x10;
            local_68 = local_68 - 1;
            plVar4 = (lcp_t *)((long)local_60 + lVar7);
            local_60 = plVar4 + 1;
            lcp1 = *plVar4;
            lVar7 = lVar7 + 8;
            goto LAB_001d259d;
          }
          pcVar6 = "n1";
        }
        __assert_fail(pcVar6,
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x665,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                     );
      }
      if (*from0 == (uchar *)0x0) goto LAB_001d27a6;
      pcVar6 = *(char **)((long)from1 + lVar7);
      if (pcVar6 == (char *)0x0) goto LAB_001d27c5;
      iVar3 = strcmp((char *)*from0,pcVar6);
      if (iVar3 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x655,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                     );
      }
      ppuVar8 = ppuVar8 + 1;
      *(char **)((long)__dest + lVar7) = pcVar6;
      lcp1 = *(lcp_t *)((long)local_60 + lVar7);
      lVar7 = lVar7 + 8;
      local_68 = local_68 - 1;
      if (local_68 == 0) {
        __dest = (uchar **)((long)__dest + lVar7);
        goto joined_r0x001d2755;
      }
    }
    puVar1 = *from0;
    if (puVar1 == (uchar *)0x0) {
LAB_001d27a6:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    if (*(char **)((long)from1 + lVar7) == (char *)0x0) {
LAB_001d27c5:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)puVar1,*(char **)((long)from1 + lVar7));
    if (-1 < iVar3) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x64f,
                    "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                   );
    }
    *(uchar **)((long)__dest + lVar7) = puVar1;
joined_r0x001d2643:
    if (local_70 == 1) {
      __dest = ppuVar8 + 1;
LAB_001d2752:
      ppuVar5 = (uchar **)((long)from1 + lVar7);
      n0 = local_68;
      goto joined_r0x001d2755;
    }
    local_60 = (lcp_t *)((long)local_60 + lVar7);
    lVar2 = lVar7 + 8;
LAB_001d259d:
    __dest = (uchar **)((long)__dest + lVar2);
    from1 = (uchar **)((long)from1 + lVar7);
    local_70 = local_70 - 1;
    from0 = from0 + 1;
    local_58 = *local_50;
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

static void
merge_lcp_2way_unstable(
               unsigned char** from0,  lcp_t* restrict lcp_input0, size_t n0,
               unsigned char** from1,  lcp_t* restrict lcp_input1, size_t n1,
               unsigned char** result, lcp_t* restrict lcp_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	check_input(from0, lcp_input0, n0);
	check_input(from1, lcp_input1, n1);
	lcp_t lcp0=0, lcp1=0;
	int cmp01; lcp_t lcp01;
	std::tie(cmp01, lcp01) = compare(*from0, *from1);
	if (cmp01 <= 0) {
		*result++ = *from0++;
		lcp0 = *lcp_input0++;
		lcp1 = lcp01;
		if (--n0 == 0) goto finish0;
	} else {
		*result++ = *from1++;
		lcp1 = *lcp_input1++;
		lcp0 = lcp01;
		if (--n1 == 0) goto finish1;
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
		        << "\tprev  = '" <<*(result-1)<<"'\n"
		        << "\tfrom0 = '"<<*from0<<"'\n"
		        << "\tfrom1 = '"<<*from1<<"'\n"
		        << "\tlcp0  = " << lcp0 << "\n"
		        << "\tlcp1  = " << lcp1 << "\n"
		        << "\n";
		check_lcps(*(result-1),*from0,lcp0,*from1,lcp1);
		if (lcp0 > lcp1) {
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			lcp0 = *lcp_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			lcp1 = *lcp_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			int cmp01; lcp_t lcp01;
			std::tie(cmp01,lcp01) = compare(*from0, *from1, lcp0);
			if (cmp01 < 0) {
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp1 = lcp01;
				if (--n0 == 0) goto finish0;
				lcp0 = *lcp_input0++;
			} else if (cmp01 == 0) {
				assert(cmp(*from0, *from1)==0);
				assert(n0); assert(n1);
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *lcp_result++ = lcp01;
				*result++ = *from0++;
				*result++ = *from1++;
				--n0;
				--n1;
				lcp0 = *lcp_input0++;
				lcp1 = *lcp_input1++;
				if (n0 == 0) goto finish0;
				if (n1 == 0) goto finish1;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp0 = lcp01;
				if (--n1 == 0) goto finish1;
				lcp1 = *lcp_input1++;
			}
		}
	}
finish0:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n0);
	if (n1) {
		std::copy(from1, from1+n1, result);
		if (OutputLCP) *lcp_result++ = lcp1;
		if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	}
	return;
finish1:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n1);
	if (n0) {
		std::copy(from0, from0+n0, result);
		if (OutputLCP) *lcp_result++ = lcp0;
		if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	}
	return;
}